

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O3

int __thiscall
BER_CONTAINER::serialise(BER_CONTAINER *this,uint8_t *buf,size_t max_len,size_t known_length)

{
  int iVar1;
  uint8_t *puVar2;
  long lVar3;
  uint8_t uVar4;
  
  iVar1 = -0x1f;
  if (1 < max_len) {
    *buf = (char)this->_type;
    lVar3 = 2;
    puVar2 = buf + 1;
    if (0x7f < known_length) {
      if (known_length < 0x101) {
        puVar2 = buf + 2;
        lVar3 = 3;
        uVar4 = 0x81;
      }
      else {
        buf[2] = (uint8_t)(known_length >> 8);
        puVar2 = buf + 3;
        lVar3 = 4;
        uVar4 = 0x82;
      }
      buf[1] = uVar4;
    }
    *puVar2 = (uint8_t)known_length;
    iVar1 = -0x1f;
    if (lVar3 + known_length <= max_len) {
      iVar1 = (int)lVar3;
    }
  }
  return iVar1;
}

Assistant:

int BER_CONTAINER::serialise(uint8_t* buf, size_t max_len, size_t known_length){
    int i = BER_CONTAINER::serialise(buf, max_len);
    CHECK_ENCODE_ERR(i);
    i += encode_ber_length_integer(buf+i, known_length, max_len - i);
    if(max_len < known_length + i) return SNMP_BUFFER_ENCODE_ERR_LEN_EXCEEDED;
    return i;
}